

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::force_recheck(torrent *this)

{
  undefined1 *puVar1;
  uint uVar2;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  element_type *peVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  error_code local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (0 < (((this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length) {
    bVar7 = should_check_files(this);
    if ((!bVar7) &&
       ((~*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xe00000000000000) != 0)) {
      clear_error(this);
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_88,stopping_torrent,(type *)0x0);
      disconnect_all(this,&local_88,bittorrent);
      stop_announcing(this);
      leave_seed_mode(this,skip_checking);
      puVar1 = &(this->super_torrent_hot_members).field_0x4b;
      *puVar1 = *puVar1 & 0xbf;
      this_00._M_head_impl =
           (this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
      if (this_00._M_head_impl != (piece_picker *)0x0) {
        peVar3 = (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        piece_picker::resize
                  (this_00._M_head_impl,(peVar3->m_files).m_total_size,
                   (peVar3->m_files).m_piece_length);
        aux::file_progress::clear(&this->m_file_progress);
        aux::file_progress::init
                  (&this->m_file_progress,
                   (EVP_PKEY_CTX *)
                   (this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl);
      }
      this->field_0x5c0 = this->field_0x5c0 & 0xf7;
      update_gauge(this);
      update_want_tick(this);
      set_state(this,checking_resume_data);
      set_queue_position(this,(queue_position_t)0x7fffffff);
      ::std::
      __uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
      ::reset((__uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               *)&this->m_add_torrent_params,(pointer)0x0);
      iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[4])();
      local_38._M_unused._M_object = (void *)0x0;
      local_38._8_8_ = 0;
      local_28 = 0;
      uStack_20 = 0;
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x38))
                ((long *)CONCAT44(extraout_var,iVar8),(this->m_storage).m_idx.m_val);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
      iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[4])();
      uVar2 = (this->m_storage).m_idx.m_val;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::torrent,void>
                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = operator_new(0x10);
      iVar8 = local_88.val_;
      uVar4 = local_88._4_4_;
      iVar5 = (int)local_88.cat_;
      iVar6 = local_88.cat_._4_4_;
      local_88.cat_ = (error_category *)0x0;
      local_88.val_ = 0;
      local_88.failed_ = false;
      local_88._5_3_ = 0;
      *(int *)local_58._M_unused._0_8_ = iVar8;
      *(undefined4 *)((long)local_58._M_unused._0_8_ + 4) = uVar4;
      *(int *)((long)local_58._M_unused._0_8_ + 8) = iVar5;
      *(int *)((long)local_58._M_unused._0_8_ + 0xc) = iVar6;
      pcStack_40 = ::std::
                   _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2354:10)>
                   ::_M_invoke;
      local_48 = ::std::
                 _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2354:10)>
                 ::_M_manager;
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x40))
                ((long *)CONCAT44(extraout_var_00,iVar9),uVar2,0,&local_78);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.cat_);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
    }
  }
  return;
}

Assistant:

piece_refcount(piece_picker& p, piece_index_t piece)
			: m_picker(p)
			, m_piece(piece)
		{
			m_picker.inc_refcount(m_piece, nullptr);
		}